

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftutil.c
# Opt level: O0

FT_Pointer
ft_mem_realloc(FT_Memory memory,FT_Long item_size,FT_Long cur_count,FT_Long new_count,void *block,
              FT_Error *p_error)

{
  FT_Error local_3c;
  FT_Error *pFStack_38;
  FT_Error error;
  FT_Error *p_error_local;
  void *block_local;
  FT_Long new_count_local;
  FT_Long cur_count_local;
  FT_Long item_size_local;
  FT_Memory memory_local;
  
  local_3c = 0;
  pFStack_38 = p_error;
  p_error_local = (FT_Error *)block;
  block_local = (void *)new_count;
  new_count_local = cur_count;
  cur_count_local = item_size;
  item_size_local = (FT_Long)memory;
  p_error_local = (FT_Error *)ft_mem_qrealloc(memory,item_size,cur_count,new_count,block,&local_3c);
  if ((local_3c == 0) && (new_count_local < (long)block_local)) {
    memset((FT_Error *)((long)p_error_local + new_count_local * cur_count_local),0,
           ((long)block_local - new_count_local) * cur_count_local);
  }
  *pFStack_38 = local_3c;
  return p_error_local;
}

Assistant:

FT_BASE_DEF( FT_Pointer )
  ft_mem_realloc( FT_Memory  memory,
                  FT_Long    item_size,
                  FT_Long    cur_count,
                  FT_Long    new_count,
                  void*      block,
                  FT_Error  *p_error )
  {
    FT_Error  error = FT_Err_Ok;


    block = ft_mem_qrealloc( memory, item_size,
                             cur_count, new_count, block, &error );
    if ( !error && new_count > cur_count )
      FT_MEM_ZERO( (char*)block + cur_count * item_size,
                   ( new_count - cur_count ) * item_size );

    *p_error = error;
    return block;
  }